

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

bool yolo_params_parse(int argc,char **argv,yolo_params *params)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  FILE *pFVar3;
  int iVar4;
  float fVar5;
  allocator<char> local_91;
  yolo_params *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string arg;
  string local_50;
  
  local_88 = &params->fname_out;
  local_80 = &params->fname_inp;
  local_78 = &params->model;
  iVar4 = 1;
  local_90 = params;
  do {
    if (argc <= iVar4) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[iVar4],(allocator<char> *)&local_50);
    bVar1 = std::operator==(&arg,"-th");
    if ((bVar1) || (bVar1 = std::operator==(&arg,"--thresh"), bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,argv[(long)iVar4 + 1],&local_91);
      fVar5 = std::__cxx11::stof(&local_50,(size_t *)0x0);
      local_90->thresh = fVar5;
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar1 = std::operator==(&arg,"-m");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--model"), bVar1)) {
        std::__cxx11::string::assign((char *)local_78);
      }
      else {
        bVar1 = std::operator==(&arg,"-i");
        if ((bVar1) || (bVar1 = std::operator==(&arg,"--inp"), bVar1)) {
          std::__cxx11::string::assign((char *)local_80);
        }
        else {
          bVar1 = std::operator==(&arg,"-o");
          if ((!bVar1) && (bVar1 = std::operator==(&arg,"--out"), !bVar1)) {
            pbVar2 = &arg;
            bVar1 = std::operator==(pbVar2,"-h");
            iVar4 = (int)pbVar2;
            if (!bVar1) {
              pbVar2 = &arg;
              bVar1 = std::operator==(pbVar2,"--help");
              iVar4 = (int)pbVar2;
              if (!bVar1) {
                pFVar3 = _stderr;
                fprintf(_stderr,"error: unknown argument: %s\n",arg._M_dataplus._M_p);
                iVar4 = (int)pFVar3;
              }
            }
            yolo_print_usage(iVar4,argv,local_90);
            exit(0);
          }
          std::__cxx11::string::assign((char *)local_88);
        }
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    iVar4 = iVar4 + 2;
  } while( true );
}

Assistant:

bool yolo_params_parse(int argc, char ** argv, yolo_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-th" || arg == "--thresh") {
            params.thresh = std::stof(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--inp") {
            params.fname_inp = argv[++i];
        } else if (arg == "-o" || arg == "--out") {
            params.fname_out = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            yolo_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            yolo_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}